

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void spell_diffusion(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  char *txt;
  AFFECT_DATA af;
  AFFECT_DATA local_90;
  
  bVar1 = is_affected_by((CHAR_DATA *)vo,0x14);
  if (bVar1) {
    txt = "They are already translucent.\n\r";
    if ((CHAR_DATA *)vo == ch) {
      txt = "You are already translucent.\n\r";
    }
  }
  else {
    init_affect(&local_90);
    local_90.where = 0;
    local_90.type = (short)sn;
    local_90.aftype = 0;
    local_90.duration = (short)(level / 3);
    local_90.location = 0;
    local_90.modifier = 0;
    local_90.bitvector[0]._2_1_ = local_90.bitvector[0]._2_1_ | 0x10;
    local_90.owner = (CHAR_DATA *)0x0;
    local_90.end_fun = (AFF_FUN *)0x0;
    local_90.level = (short)level;
    act("An odd tingling washes over you as your density is decreased to the point of translucence."
        ,(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,3);
    act("$n\'s body seems to stretch slightly as $e becomes translucent!",(CHAR_DATA *)vo,
        (void *)0x0,(void *)0x0,0);
    local_90.mod_name = 6;
    new_affect_to_char((CHAR_DATA *)vo,&local_90);
    if (ch == (CHAR_DATA *)vo) {
      return;
    }
    txt = "Ok.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void spell_diffusion(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;

	if (!is_affected_by(victim, AFF_PASS_DOOR))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = sn;
		af.aftype = AFT_SPELL;
		af.level = level;
		af.duration = level / 3;
		af.location = 0;
		af.modifier = 0;

		SET_BIT(af.bitvector, AFF_PASS_DOOR);

		af.owner = nullptr;
		af.end_fun = nullptr;

		act("An odd tingling washes over you as your density is decreased to the point of translucence.", victim, nullptr, nullptr, TO_CHAR);
		act("$n's body seems to stretch slightly as $e becomes translucent!", victim, nullptr, nullptr, TO_ROOM);

		af.mod_name = MOD_PHASE;
		new_affect_to_char(victim, &af);

		if (ch != victim)
			send_to_char("Ok.\n\r", ch);
	}
	else
	{
		if (victim == ch)
			send_to_char("You are already translucent.\n\r", ch);
		else
			send_to_char("They are already translucent.\n\r", ch);
	}
}